

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__horizontal_gather_3_channels_with_n_coeffs_mod2
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  int iVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  long lVar8;
  float *pfVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  pfVar6 = horizontal_coefficients + 4;
  pfVar5 = output_buffer;
  do {
    lVar8 = (long)(horizontal_contributors->n0 * 3);
    pfVar3 = decode_buffer + lVar8;
    fVar20 = *horizontal_coefficients;
    fVar11 = horizontal_coefficients[1];
    fVar14 = horizontal_coefficients[2];
    fVar17 = horizontal_coefficients[3];
    fVar18 = *pfVar3 * fVar20;
    fVar19 = pfVar3[1] * fVar20;
    fVar20 = pfVar3[2] * fVar20;
    fVar21 = pfVar3[3] * fVar11;
    fVar10 = fVar11 * pfVar3[4];
    fVar11 = fVar11 * pfVar3[5];
    fVar12 = fVar14 * pfVar3[6];
    fVar13 = fVar14 * pfVar3[7];
    fVar14 = fVar14 * pfVar3[8];
    fVar15 = fVar17 * pfVar3[9];
    fVar16 = fVar17 * pfVar3[10];
    fVar17 = fVar17 * pfVar3[0xb];
    iVar4 = ((horizontal_contributors->n1 - horizontal_contributors->n0) + -2 >> 2) + 1;
    pfVar3 = decode_buffer + lVar8 + 0xc;
    pfVar9 = pfVar6;
    do {
      pfVar7 = pfVar3;
      fVar22 = *pfVar9;
      fVar23 = pfVar9[1];
      fVar1 = pfVar9[2];
      fVar2 = pfVar9[3];
      fVar18 = fVar18 + *pfVar7 * fVar22;
      fVar19 = fVar19 + pfVar7[1] * fVar22;
      fVar20 = fVar20 + pfVar7[2] * fVar22;
      fVar21 = fVar21 + pfVar7[3] * fVar23;
      fVar10 = fVar10 + fVar23 * pfVar7[4];
      fVar11 = fVar11 + fVar23 * pfVar7[5];
      fVar12 = fVar12 + fVar1 * pfVar7[6];
      fVar13 = fVar13 + fVar1 * pfVar7[7];
      fVar14 = fVar14 + fVar1 * pfVar7[8];
      fVar15 = fVar15 + fVar2 * pfVar7[9];
      fVar16 = fVar16 + fVar2 * pfVar7[10];
      fVar17 = fVar17 + fVar2 * pfVar7[0xb];
      iVar4 = iVar4 + -1;
      pfVar9 = pfVar9 + 4;
      pfVar3 = pfVar7 + 0xc;
    } while (1 < iVar4);
    fVar22 = (float)*(undefined8 *)pfVar9;
    fVar23 = (float)((ulong)*(undefined8 *)pfVar9 >> 0x20);
    fVar20 = fVar20 + pfVar7[0xe] * fVar22;
    fVar21 = fVar21 + pfVar7[0xf] * fVar23;
    fVar12 = fVar12 + 0.0 + fVar18 + pfVar7[0xc] * fVar22 + fVar15 + fVar21;
    fVar10 = fVar13 + 0.0 + fVar19 + pfVar7[0xd] * fVar22 +
             fVar16 + fVar10 + (float)*(undefined8 *)(pfVar7 + 0x10) * fVar23;
    fVar11 = fVar14 + fVar20 +
             fVar17 + fVar11 + (float)((ulong)*(undefined8 *)(pfVar7 + 0x10) >> 0x20) * fVar23;
    pfVar3 = pfVar5 + 3;
    if (pfVar3 < output_buffer + output_sub_size * 3) {
      *pfVar5 = fVar12;
      pfVar5[1] = fVar10;
      pfVar5[2] = fVar11;
      pfVar5[3] = fVar15 + fVar21 + fVar14 + fVar20;
    }
    else {
      *(ulong *)pfVar5 = CONCAT44(fVar10,fVar12);
      pfVar5[2] = fVar11;
    }
    horizontal_coefficients = horizontal_coefficients + coefficient_width;
    horizontal_contributors = horizontal_contributors + 1;
    pfVar6 = pfVar6 + coefficient_width;
    pfVar5 = pfVar3;
  } while (pfVar3 < output_buffer + output_sub_size * 3);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_n_coeffs_mod2 )( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    int n = ( ( horizontal_contributors->n1 - horizontal_contributors->n0 + 1 ) - 6 + 3 ) >> 2;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    STBIR_SIMD_NO_UNROLL_LOOP_START
    do {
      hc += 4;
      decode += STBIR__horizontal_channels * 4;
      stbir__4_coeff_continue_from_4( 0 );
      --n;
    } while ( n > 0 );
    stbir__2_coeff_remnant( 4 );

    stbir__store_output();
  } while ( output < output_end );
}